

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *loop;
  watcher_list *pwVar4;
  uv__queue *puVar5;
  int iVar6;
  watcher_list *pwVar7;
  size_t sVar8;
  watcher_list *pwVar9;
  int *piVar10;
  watcher_list **ppwVar11;
  watcher_list *pwVar12;
  bool bVar13;
  watcher_list *pwVar14;
  watcher_list *pwVar15;
  void **ppvVar16;
  
  if ((handle->flags & 4) != 0) {
    return -0x16;
  }
  loop = handle->loop;
  if (loop->inotify_fd == -1) {
    iVar6 = inotify_init1(0x80800);
    if (iVar6 < 0) {
      piVar10 = __errno_location();
      if (*piVar10 != 0) {
        return -*piVar10;
      }
    }
    else {
      loop->inotify_fd = iVar6;
      uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar6);
      uv__io_start(loop,&loop->inotify_read_watcher,1);
    }
  }
  iVar6 = inotify_add_watch(loop->inotify_fd,path,0xfc6);
  if (iVar6 == -1) {
    piVar10 = __errno_location();
    return -*piVar10;
  }
  pwVar7 = find_watcher(loop,iVar6);
  if (pwVar7 == (watcher_list *)0x0) {
    sVar8 = strlen(path);
    pwVar7 = (watcher_list *)uv__malloc(sVar8 + 0x49);
    if (pwVar7 == (watcher_list *)0x0) {
      return -0xc;
    }
    pwVar7->wd = iVar6;
    memcpy(pwVar7 + 1,path,sVar8 + 1);
    pwVar7->path = (char *)(pwVar7 + 1);
    (pwVar7->watchers).next = &pwVar7->watchers;
    (pwVar7->watchers).prev = &pwVar7->watchers;
    pwVar7->iterating = 0;
    ppvVar16 = &loop->inotify_watchers;
    bVar13 = false;
    pwVar9 = (watcher_list *)0x0;
    pwVar14 = (watcher_list *)ppvVar16;
    while (pwVar14 = (pwVar14->entry).rbe_left, pwVar14 != (watcher_list *)0x0) {
      iVar2 = pwVar14->wd;
      bVar13 = iVar6 < iVar2;
      pwVar9 = pwVar14;
      if (iVar2 <= iVar6) {
        if (iVar6 <= iVar2) goto LAB_00123ae6;
        pwVar14 = (watcher_list *)&(pwVar14->entry).rbe_right;
      }
    }
    (pwVar7->entry).rbe_parent = pwVar9;
    (pwVar7->entry).rbe_left = (watcher_list *)0x0;
    (pwVar7->entry).rbe_right = (watcher_list *)0x0;
    (pwVar7->entry).rbe_color = 1;
    ppwVar11 = &(pwVar9->entry).rbe_left + ((byte)~bVar13 & 1);
    if (pwVar9 == (watcher_list *)0x0) {
      ppwVar11 = (watcher_list **)ppvVar16;
    }
    *ppwVar11 = pwVar7;
    pwVar14 = pwVar7;
    while ((pwVar9 = (pwVar14->entry).rbe_parent, pwVar9 != (watcher_list *)0x0 &&
           ((pwVar9->entry).rbe_color == 1))) {
      pwVar4 = (pwVar9->entry).rbe_parent;
      pwVar15 = (pwVar4->entry).rbe_left;
      pwVar12 = pwVar14;
      if (pwVar9 == pwVar15) {
        pwVar15 = (pwVar4->entry).rbe_right;
        if ((pwVar15 != (watcher_list *)0x0) && ((pwVar15->entry).rbe_color == 1))
        goto LAB_0012399a;
        pwVar15 = (pwVar9->entry).rbe_right;
        if (pwVar15 == pwVar14) {
          pwVar12 = (pwVar15->entry).rbe_left;
          (pwVar9->entry).rbe_right = pwVar12;
          if (pwVar12 == (watcher_list *)0x0) {
            (pwVar15->entry).rbe_parent = pwVar4;
            pwVar12 = (pwVar9->entry).rbe_parent;
LAB_00123a76:
            ppwVar11 = &(pwVar12->entry).rbe_left + (pwVar9 != (pwVar12->entry).rbe_left);
          }
          else {
            (pwVar12->entry).rbe_parent = pwVar9;
            pwVar12 = (pwVar9->entry).rbe_parent;
            (pwVar15->entry).rbe_parent = pwVar12;
            ppwVar11 = (watcher_list **)ppvVar16;
            if (pwVar12 != (watcher_list *)0x0) goto LAB_00123a76;
          }
          *ppwVar11 = pwVar15;
          (pwVar15->entry).rbe_left = pwVar9;
          (pwVar9->entry).rbe_parent = pwVar15;
          pwVar12 = pwVar9;
          pwVar9 = pwVar14;
        }
        (pwVar9->entry).rbe_color = 0;
        (pwVar4->entry).rbe_color = 1;
        pwVar14 = (pwVar4->entry).rbe_left;
        pwVar9 = (pwVar14->entry).rbe_right;
        (pwVar4->entry).rbe_left = pwVar9;
        if (pwVar9 != (watcher_list *)0x0) {
          (pwVar9->entry).rbe_parent = pwVar4;
        }
        pwVar9 = (pwVar4->entry).rbe_parent;
        (pwVar14->entry).rbe_parent = pwVar9;
        ppwVar11 = (watcher_list **)ppvVar16;
        if (pwVar9 != (watcher_list *)0x0) {
          ppwVar11 = &(pwVar9->entry).rbe_left + (pwVar4 != (pwVar9->entry).rbe_left);
        }
        *ppwVar11 = pwVar14;
        (pwVar14->entry).rbe_right = pwVar4;
LAB_00123ad3:
        (pwVar4->entry).rbe_parent = pwVar14;
        pwVar14 = pwVar12;
      }
      else {
        if ((pwVar15 == (watcher_list *)0x0) || ((pwVar15->entry).rbe_color != 1)) {
          pwVar15 = (pwVar9->entry).rbe_left;
          if (pwVar15 == pwVar14) {
            pwVar12 = (pwVar15->entry).rbe_right;
            (pwVar9->entry).rbe_left = pwVar12;
            if (pwVar12 == (watcher_list *)0x0) {
              (pwVar15->entry).rbe_parent = pwVar4;
              pwVar12 = (pwVar9->entry).rbe_parent;
LAB_00123a0e:
              ppwVar11 = &(pwVar12->entry).rbe_left + (pwVar9 != (pwVar12->entry).rbe_left);
            }
            else {
              (pwVar12->entry).rbe_parent = pwVar9;
              pwVar12 = (pwVar9->entry).rbe_parent;
              (pwVar15->entry).rbe_parent = pwVar12;
              ppwVar11 = (watcher_list **)ppvVar16;
              if (pwVar12 != (watcher_list *)0x0) goto LAB_00123a0e;
            }
            *ppwVar11 = pwVar15;
            (pwVar15->entry).rbe_right = pwVar9;
            (pwVar9->entry).rbe_parent = pwVar15;
            pwVar12 = pwVar9;
            pwVar9 = pwVar14;
          }
          (pwVar9->entry).rbe_color = 0;
          (pwVar4->entry).rbe_color = 1;
          pwVar14 = (pwVar4->entry).rbe_right;
          pwVar9 = (pwVar14->entry).rbe_left;
          (pwVar4->entry).rbe_right = pwVar9;
          if (pwVar9 != (watcher_list *)0x0) {
            (pwVar9->entry).rbe_parent = pwVar4;
          }
          pwVar9 = (pwVar4->entry).rbe_parent;
          (pwVar14->entry).rbe_parent = pwVar9;
          ppwVar11 = (watcher_list **)ppvVar16;
          if (pwVar9 != (watcher_list *)0x0) {
            ppwVar11 = &(pwVar9->entry).rbe_left + (pwVar4 != (pwVar9->entry).rbe_left);
          }
          *ppwVar11 = pwVar14;
          (pwVar14->entry).rbe_left = pwVar4;
          goto LAB_00123ad3;
        }
LAB_0012399a:
        (pwVar15->entry).rbe_color = 0;
        (pwVar9->entry).rbe_color = 0;
        (pwVar4->entry).rbe_color = 1;
        pwVar14 = pwVar4;
      }
    }
    *(undefined4 *)((long)*ppvVar16 + 0x18) = 0;
  }
LAB_00123ae6:
  uVar3 = handle->flags;
  if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 + 1;
  }
  (handle->watchers).next = &pwVar7->watchers;
  puVar5 = (pwVar7->watchers).prev;
  (handle->watchers).prev = puVar5;
  puVar5->next = &handle->watchers;
  (pwVar7->watchers).prev = &handle->watchers;
  handle->path = pwVar7->path;
  handle->cb = cb;
  handle->wd = iVar6;
  return 0;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  uv_loop_t* loop;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  loop = handle->loop;

  err = init_inotify(loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  uv__queue_init(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, uv__inotify_watchers(loop), w);

no_insert:
  uv__handle_start(handle);
  uv__queue_insert_tail(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}